

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O0

ptr<rpc_client> __thiscall nuraft::FakeNetwork::create_client(FakeNetwork *this,string *endpoint)

{
  bool bVar1;
  iterator this_00;
  mapped_type *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  FakeNetworkBase *in_RDI;
  ptr<rpc_client> pVar3;
  ptr<FakeClient> ret;
  iterator entry;
  lock_guard<std::mutex> ll;
  FakeNetwork *dst_net;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
  *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  FakeNetworkBase *this_01;
  key_type *in_stack_ffffffffffffff98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
  *in_stack_ffffffffffffffa0;
  _Self local_48 [3];
  _Self local_30 [2];
  FakeNetwork *local_20;
  
  this_01 = in_RDI;
  std::__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x13f812);
  local_20 = FakeNetworkBase::findNetwork(this_01,in_stack_ffffffffffffff70);
  if (local_20 == (FakeNetwork *)0x0) {
    std::shared_ptr<nuraft::rpc_client>::shared_ptr
              ((shared_ptr<nuraft::rpc_client> *)in_stack_ffffffffffffff60._M_node,
               in_stack_ffffffffffffff58);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60._M_node,
               (mutex_type *)in_stack_ffffffffffffff58);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
              ::find(in_stack_ffffffffffffff58,(key_type *)0x13f877);
    local_30[0]._M_node = this_00._M_node;
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(local_30,local_48);
    if (bVar1) {
      in_stack_ffffffffffffff68._M_node = (_Base_ptr)(in_RSI + 0xb8);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>
                    *)0x13f8ca);
      std::__cxx11::
      list<std::shared_ptr<nuraft::FakeClient>,_std::allocator<std::shared_ptr<nuraft::FakeClient>_>_>
      ::push_back((list<std::shared_ptr<nuraft::FakeClient>,_std::allocator<std::shared_ptr<nuraft::FakeClient>_>_>
                   *)this_00._M_node,(value_type *)in_stack_ffffffffffffff68._M_node);
      in_stack_ffffffffffffff60 =
           std::
           map<std::__cxx11::string,std::shared_ptr<nuraft::FakeClient>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<nuraft::FakeClient>>>>
           ::erase_abi_cxx11_(in_stack_ffffffffffffff60._M_node,in_stack_ffffffffffffff68);
    }
    cs_new<nuraft::FakeClient,nuraft::FakeNetwork*,nuraft::FakeNetwork*&>
              ((FakeNetwork **)in_stack_ffffffffffffff68._M_node,
               (FakeNetwork **)in_stack_ffffffffffffff60._M_node);
    __r = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
          ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::shared_ptr<nuraft::FakeClient>::operator=
              ((shared_ptr<nuraft::FakeClient> *)in_stack_ffffffffffffff60._M_node,__r);
    std::shared_ptr<nuraft::rpc_client>::shared_ptr<nuraft::FakeClient,void>
              ((shared_ptr<nuraft::rpc_client> *)in_stack_ffffffffffffff60._M_node,__r);
    std::shared_ptr<nuraft::FakeClient>::~shared_ptr((shared_ptr<nuraft::FakeClient> *)0x13f986);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13f993);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<rpc_client>)pVar3.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<rpc_client> FakeNetwork::create_client(const std::string& endpoint) {
    FakeNetwork* dst_net = base->findNetwork(endpoint);
    if (!dst_net) return nullptr;

    std::lock_guard<std::mutex> ll(clientsLock);
    auto entry = clients.find(endpoint);
    if (entry != clients.end()) {
        // Already exists, move it to garbage list as it will be
        // replaced below.
        staleClients.push_back(entry->second);
        clients.erase(entry);
    }

    ptr<FakeClient> ret = cs_new<FakeClient>(this, dst_net);
    clients[endpoint] = ret;
    return ret;
}